

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGP4.cc
# Opt level: O1

Eci * libsgp4::SGP4::CalculateFinalPositionVelocity
                (Eci *__return_storage_ptr__,DateTime *dt,double e,double a,double omega,double xl,
                double xnode,double xinc,double xlcof,double aycof,double x3thm1,double x1mth2,
                double x7thm1,double cosio,double sinio)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  SatelliteException *this;
  DecayedException *this_00;
  uint uVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  Vector velocity;
  Vector position;
  Vector local_60;
  Vector local_40;
  
  dVar5 = kXKE;
  dVar1 = pow(a,1.5);
  dVar2 = cos(omega);
  dVar2 = dVar2 * e;
  dVar16 = 1.0 / ((1.0 - e * e) * a);
  dVar3 = sin(omega);
  dVar3 = dVar3 * e + aycof * dVar16;
  dVar9 = dVar2 * dVar2 + dVar3 * dVar3;
  if (1.0 <= dVar9) {
    this = (SatelliteException *)__cxa_allocate_exception(0x10);
    SatelliteException::SatelliteException(this,"Error: (elsq >= 1.0)");
  }
  else {
    dVar16 = fmod((dVar16 * xlcof * dVar2 + xl) - xnode,6.283185307179586);
    if (dVar9 < 0.0) {
      dVar11 = sqrt(dVar9);
    }
    else {
      dVar11 = SQRT(dVar9);
    }
    dVar11 = ABS(dVar11) * 1.25;
    uVar7 = 0;
    bVar8 = true;
    dVar12 = dVar16;
    do {
      dVar18 = sin(dVar12);
      dVar15 = cos(dVar12);
      dVar6 = kXKE;
      dVar4 = dVar2 * dVar15 + dVar3 * dVar18;
      dVar14 = dVar2 * dVar18 + dVar15 * -dVar3;
      dVar13 = (dVar16 - dVar12) + dVar14;
      if (1e-12 <= ABS(dVar13)) {
        dVar17 = 1.0 - dVar4;
        dVar10 = dVar13 / dVar17;
        if (uVar7 == 0) {
          dVar13 = dVar11;
          if ((dVar10 <= dVar11) && (dVar13 = dVar10, dVar10 < -dVar11)) {
            dVar13 = -dVar11;
          }
        }
        else {
          dVar13 = dVar13 / (dVar14 * 0.5 * dVar10 + dVar17);
        }
        dVar12 = dVar12 + dVar13;
      }
      else {
        bVar8 = false;
      }
    } while ((uVar7 < 9) && (uVar7 = uVar7 + 1, bVar8));
    dVar9 = 1.0 - dVar9;
    dVar16 = dVar9 * a;
    if (0.0 <= dVar16) {
      dVar11 = (1.0 - dVar4) * a;
      if (a < 0.0) {
        dVar12 = sqrt(a);
      }
      else {
        dVar12 = SQRT(a);
      }
      dVar4 = kXKE;
      dVar13 = 1.0 / dVar11;
      if (dVar16 < 0.0) {
        dVar10 = sqrt(dVar16);
      }
      else {
        dVar10 = SQRT(dVar16);
      }
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      dVar17 = 1.0 / (dVar9 + 1.0);
      dVar15 = (dVar3 * dVar14 * dVar17 + (dVar15 - dVar2)) * a * dVar13;
      dVar2 = ((dVar18 - dVar3) - dVar14 * dVar2 * dVar17) * a * dVar13;
      dVar3 = atan2(dVar2,dVar15);
      dVar20 = (dVar2 + dVar2) * dVar15;
      dVar18 = (1.0 / dVar16) * 0.000541308;
      dVar2 = (1.0 / dVar16) * dVar18;
      dVar19 = dVar2 * 1.5;
      dVar16 = (dVar15 + dVar15) * dVar15 + -1.0;
      dVar17 = dVar11 * (1.0 - dVar9 * dVar19 * x3thm1) + dVar18 * 0.5 * x1mth2 * dVar16;
      dVar3 = dVar3 + dVar2 * -0.25 * x7thm1 * dVar20;
      dVar19 = dVar19 * cosio;
      dVar11 = dVar19 * dVar20 + xnode;
      dVar9 = dVar19 * sinio * dVar16 + xinc;
      dVar18 = (dVar5 / dVar1) * dVar18;
      dVar12 = dVar6 * dVar12 * dVar14 * dVar13 - dVar18 * x1mth2 * dVar20;
      dVar15 = (dVar16 * x1mth2 + x3thm1 * 1.5) * dVar18 + dVar4 * dVar10 * dVar13;
      dVar1 = sin(dVar3);
      dVar2 = cos(dVar3);
      dVar3 = sin(dVar9);
      dVar9 = cos(dVar9);
      dVar16 = sin(dVar11);
      dVar5 = cos(dVar11);
      dVar11 = -dVar16 * dVar9 * dVar1 + dVar2 * dVar5;
      dVar18 = dVar9 * dVar5 * dVar1 + dVar2 * dVar16;
      local_40.x = dVar17 * dVar11 * 6378.135;
      local_40.y = dVar17 * dVar18 * 6378.135;
      local_40.z = dVar1 * dVar3 * dVar17 * 6378.135;
      local_40.w = 0.0;
      local_60.x = ((dVar11 * dVar12 + (-dVar16 * dVar9 * dVar2 - dVar5 * dVar1) * dVar15) *
                   6378.135) / 60.0;
      local_60.y = ((dVar18 * dVar12 + (dVar9 * dVar5 * dVar2 - dVar1 * dVar16) * dVar15) * 6378.135
                   ) / 60.0;
      local_60.z = ((dVar1 * dVar3 * dVar12 + dVar2 * dVar3 * dVar15) * 6378.135) / 60.0;
      local_60.w = 0.0;
      if (1.0 <= dVar17) {
        (__return_storage_ptr__->m_dt).m_encoded = dt->m_encoded;
        (__return_storage_ptr__->m_position).x = 0.0;
        (__return_storage_ptr__->m_position).y = 0.0;
        (__return_storage_ptr__->m_position).z = 0.0;
        (__return_storage_ptr__->m_position).w = 0.0;
        (__return_storage_ptr__->m_position).x = local_40.x;
        (__return_storage_ptr__->m_position).y = local_40.y;
        (__return_storage_ptr__->m_position).z = local_40.z;
        (__return_storage_ptr__->m_position).w = 0.0;
        (__return_storage_ptr__->m_velocity).x = 0.0;
        (__return_storage_ptr__->m_velocity).y = 0.0;
        (__return_storage_ptr__->m_velocity).z = 0.0;
        (__return_storage_ptr__->m_velocity).x = local_60.x;
        (__return_storage_ptr__->m_velocity).y = local_60.y;
        (__return_storage_ptr__->m_velocity).z = local_60.z;
        (__return_storage_ptr__->m_velocity).w = 0.0;
        return __return_storage_ptr__;
      }
      this_00 = (DecayedException *)__cxa_allocate_exception(0x58);
      DecayedException::DecayedException(this_00,dt,&local_40,&local_60);
      __cxa_throw(this_00,&DecayedException::typeinfo,std::runtime_error::~runtime_error);
    }
    this = (SatelliteException *)__cxa_allocate_exception(0x10);
    SatelliteException::SatelliteException(this,"Error: (pl < 0.0)");
  }
  __cxa_throw(this,&SatelliteException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Eci SGP4::CalculateFinalPositionVelocity(
        const DateTime& dt,
        const double e,
        const double a,
        const double omega,
        const double xl,
        const double xnode,
        const double xinc,
        const double xlcof,
        const double aycof,
        const double x3thm1,
        const double x1mth2,
        const double x7thm1,
        const double cosio,
        const double sinio)
{
    const double beta2 = 1.0 - e * e;
    const double xn = kXKE / pow(a, 1.5);
    /*
     * long period periodics
     */
    const double axn = e * cos(omega);
    const double temp11 = 1.0 / (a * beta2);
    const double xll = temp11 * xlcof * axn;
    const double aynl = temp11 * aycof;
    const double xlt = xl + xll;
    const double ayn = e * sin(omega) + aynl;
    const double elsq = axn * axn + ayn * ayn;

    if (elsq >= 1.0)
    {
        throw SatelliteException("Error: (elsq >= 1.0)");
    }

    /*
     * solve keplers equation
     * - solve using Newton-Raphson root solving
     * - here capu is almost the mean anomoly
     * - initialise the eccentric anomaly term epw
     * - The fmod saves reduction of angle to +/-2pi in sin/cos() and prevents
     * convergence problems.
     */
    const double capu = fmod(xlt - xnode, kTWOPI);
    double epw = capu;

    double sinepw = 0.0;
    double cosepw = 0.0;
    double ecose = 0.0;
    double esine = 0.0;

    /*
     * sensibility check for N-R correction
     */
    const double max_newton_naphson = 1.25 * fabs(sqrt(elsq));

    bool kepler_running = true;

    for (int i = 0; i < 10 && kepler_running; i++)
    {
        sinepw = sin(epw);
        cosepw = cos(epw);
        ecose = axn * cosepw + ayn * sinepw;
        esine = axn * sinepw - ayn * cosepw;

        double f = capu - epw + esine;

        if (fabs(f) < 1.0e-12)
        {
            kepler_running = false;
        }
        else
        {
            /*
             * 1st order Newton-Raphson correction
             */
            const double fdot = 1.0 - ecose;
            double delta_epw = f / fdot;

            /*
             * 2nd order Newton-Raphson correction.
             * f / (fdot - 0.5 * d2f * f/fdot)
             */
            if (i == 0)
            {
                if (delta_epw > max_newton_naphson)
                {
                    delta_epw = max_newton_naphson;
                }
                else if (delta_epw < -max_newton_naphson)
                {
                    delta_epw = -max_newton_naphson;
                }
            }
            else
            {
                delta_epw = f / (fdot + 0.5 * esine * delta_epw);
            }

            /*
             * Newton-Raphson correction of -F/DF
             */
            epw += delta_epw;
        }
    }
    /*
     * short period preliminary quantities
     */
    const double temp21 = 1.0 - elsq;
    const double pl = a * temp21;

    if (pl < 0.0)
    {
        throw SatelliteException("Error: (pl < 0.0)");
    }

    const double r = a * (1.0 - ecose);
    const double temp31 = 1.0 / r;
    const double rdot = kXKE * sqrt(a) * esine * temp31;
    const double rfdot = kXKE * sqrt(pl) * temp31;
    const double temp32 = a * temp31;
    const double betal = sqrt(temp21);
    const double temp33 = 1.0 / (1.0 + betal);
    const double cosu = temp32 * (cosepw - axn + ayn * esine * temp33);
    const double sinu = temp32 * (sinepw - ayn - axn * esine * temp33);
    const double u = atan2(sinu, cosu);
    const double sin2u = 2.0 * sinu * cosu;
    const double cos2u = 2.0 * cosu * cosu - 1.0;

    /*
     * update for short periodics
     */
    const double temp41 = 1.0 / pl;
    const double temp42 = kCK2 * temp41;
    const double temp43 = temp42 * temp41;

    const double rk = r * (1.0 - 1.5 * temp43 * betal * x3thm1)
        + 0.5 * temp42 * x1mth2 * cos2u;
    const double uk = u - 0.25 * temp43 * x7thm1 * sin2u;
    const double xnodek = xnode + 1.5 * temp43 * cosio * sin2u;
    const double xinck = xinc + 1.5 * temp43 * cosio * sinio * cos2u;
    const double rdotk = rdot - xn * temp42 * x1mth2 * sin2u;
    const double rfdotk = rfdot + xn * temp42 * (x1mth2 * cos2u + 1.5 * x3thm1);

    /*
     * orientation vectors
     */
    const double sinuk = sin(uk);
    const double cosuk = cos(uk);
    const double sinik = sin(xinck);
    const double cosik = cos(xinck);
    const double sinnok = sin(xnodek);
    const double cosnok = cos(xnodek);
    const double xmx = -sinnok * cosik;
    const double xmy = cosnok * cosik;
    const double ux = xmx * sinuk + cosnok * cosuk;
    const double uy = xmy * sinuk + sinnok * cosuk;
    const double uz = sinik * sinuk;
    const double vx = xmx * cosuk - cosnok * sinuk;
    const double vy = xmy * cosuk - sinnok * sinuk;
    const double vz = sinik * cosuk;
    /*
     * position and velocity
     */
    const double x = rk * ux * kXKMPER;
    const double y = rk * uy * kXKMPER;
    const double z = rk * uz * kXKMPER;
    Vector position(x, y, z);
    const double xdot = (rdotk * ux + rfdotk * vx) * kXKMPER / 60.0;
    const double ydot = (rdotk * uy + rfdotk * vy) * kXKMPER / 60.0;
    const double zdot = (rdotk * uz + rfdotk * vz) * kXKMPER / 60.0;
    Vector velocity(xdot, ydot, zdot);

    if (rk < 1.0)
    {
        throw DecayedException(
                dt,
                position,
                velocity);
    }

    return Eci(dt, position, velocity);
}